

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

int Gia_FormStrCount(char *pStr,int *pnVars,int *pnPars)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char cVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  int *piVar8;
  int iVar9;
  
  if (*pStr == '(') {
    sVar3 = strlen(pStr);
    if (pStr[sVar3 - 1] == ')') {
      pcVar7 = pStr + 1;
      iVar2 = 0;
      cVar4 = '(';
      do {
        if (cVar4 == '(') {
          iVar2 = iVar2 + 1;
        }
        else if (cVar4 == ')') {
          iVar2 = iVar2 + -1;
        }
        else if (cVar4 == '\0') goto LAB_00494784;
        cVar4 = *pcVar7;
        pcVar7 = pcVar7 + 1;
      } while( true );
    }
    pcVar7 = "The last symbol should be the closing parenthesis \")\".";
  }
  else {
    pcVar7 = "The first symbol should be the opening parenthesis \"(\".";
  }
  goto LAB_0049478f;
LAB_00494784:
  if (iVar2 == 0) {
    *pnVars = 0;
    *pnPars = 0;
    pcVar7 = pStr + 1;
    do {
      bVar1 = pcVar7[-1];
      uVar5 = (uint)(char)bVar1;
      if (uVar5 == 0) {
        uVar6 = (ulong)(uint)*pnVars;
        if (*pnVars == 2) {
          if (0xfffffff7 < *pnPars - 9U) {
            return 0;
          }
          pcVar7 = "The number of parameters should be between 1 and %d\n";
          uVar6 = 8;
        }
        else {
          pcVar7 = "The number of input variables (%d) should be 2\n";
        }
LAB_00494859:
        printf(pcVar7,uVar6);
        return 1;
      }
      iVar2 = -0x60;
      piVar8 = pnVars;
      if (((byte)(bVar1 + 0x9f) < 2) || (iVar2 = -0x6f, piVar8 = pnPars, (bVar1 & 0xfc) == 0x70)) {
        iVar9 = iVar2 + uVar5;
        if ((int)(iVar2 + uVar5) < *piVar8) {
          iVar9 = *piVar8;
        }
        *piVar8 = iVar9;
      }
      else if (((0x38 < bVar1 - 0x26) ||
               ((0x10000000210000dU >> ((ulong)(bVar1 - 0x26) & 0x3f) & 1) == 0)) && (bVar1 != 0x7c)
              ) {
        if (bVar1 != 0x7e) {
          printf("Unknown symbol (%c) in the formula (%s)\n",(ulong)uVar5,pStr);
          return 1;
        }
        uVar6 = (ulong)(uint)(int)*pcVar7;
        if ((byte)(*pcVar7 + 0x85U) < 0xe6) {
          pcVar7 = "Expecting alphabetic symbol (instead of \"%c\") after negation (~)\n";
          goto LAB_00494859;
        }
      }
      pcVar7 = pcVar7 + 1;
    } while( true );
  }
  pcVar7 = "The number of opening and closing parentheses is not equal.";
LAB_0049478f:
  puts(pcVar7);
  return 1;
}

Assistant:

int Gia_FormStrCount( char * pStr, int * pnVars, int * pnPars )
{
    int i, Counter = 0;
    if ( pStr[0] != '(' )
    {
        printf( "The first symbol should be the opening parenthesis \"(\".\n" );
        return 1;
    }
    if ( pStr[strlen(pStr)-1] != ')' )
    {
        printf( "The last symbol should be the closing parenthesis \")\".\n" );
        return 1;
    }
    for ( i = 0; pStr[i]; i++ )
        if (  pStr[i] == '(' )
            Counter++;
        else if (  pStr[i] == ')' )
            Counter--;
    if ( Counter != 0 )
    {
        printf( "The number of opening and closing parentheses is not equal.\n" );
        return 1;
    }
    *pnVars = 0;
    *pnPars = 0;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] >= 'a' && pStr[i] <= 'b' )
            *pnVars = Abc_MaxInt( *pnVars, pStr[i] - 'a' + 1 );
        else if ( pStr[i] >= 'p' && pStr[i] <= 's' )
            *pnPars = Abc_MaxInt( *pnPars, pStr[i] - 'p' + 1 );
        else if ( pStr[i] == '(' || pStr[i] == ')' )
        {}
        else if ( pStr[i] == '&' || pStr[i] == '|' || pStr[i] == '^' )
        {}
        else if ( pStr[i] == '?' || pStr[i] == ':' )
        {}
        else if ( pStr[i] == '~' )
        {
            if ( pStr[i+1] < 'a' || pStr[i+1] > 'z' )
            {
                printf( "Expecting alphabetic symbol (instead of \"%c\") after negation (~)\n",  pStr[i+1] );
                return 1;
            }
        }
        else 
        {
            printf( "Unknown symbol (%c) in the formula (%s)\n", pStr[i], pStr );
            return 1;
        }
    }
    if ( *pnVars != FFTEST_MAX_VARS )
        { printf( "The number of input variables (%d) should be 2\n", *pnVars ); return 1; }
    if ( *pnPars < 1 || *pnPars > FFTEST_MAX_PARS )
        { printf( "The number of parameters should be between 1 and %d\n", FFTEST_MAX_PARS ); return 1; }
    return 0;
}